

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t COVER_checkTotalCompressedSize
                 (ZDICT_cover_params_t parameters,size_t *samplesSizes,BYTE *samples,size_t *offsets
                 ,size_t nbTrainSamples,size_t nbSamples,BYTE *dict,size_t dictBufferCapacity)

{
  ZSTD_customMem customMem;
  ulong uVar1;
  void *dst;
  ZSTD_CCtx *cctx;
  ZSTD_CDict *cdict;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  void *unaff_RBX;
  size_t __size;
  size_t sVar5;
  bool bVar6;
  
  uVar1 = 0;
  if (1.0 <= parameters.splitPoint) {
    nbTrainSamples = uVar1;
  }
  if (nbTrainSamples < nbSamples) {
    uVar1 = 0;
    uVar3 = nbTrainSamples;
    do {
      if (uVar1 < samplesSizes[uVar3]) {
        uVar1 = samplesSizes[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while (nbSamples != uVar3);
  }
  if (uVar1 < 0xff00ff00ff00ff00) {
    uVar3 = 0;
    if (uVar1 < 0x20000) {
      uVar3 = -(uVar1 - 0x20000) >> 0xb;
    }
    sVar4 = (uVar1 >> 8) + uVar1 + uVar3;
  }
  else {
    sVar4 = 0;
  }
  __size = 0xffffffffffffffb8;
  if (sVar4 != 0) {
    __size = sVar4;
  }
  dst = malloc(__size);
  customMem.customFree = (ZSTD_freeFunction)offsets;
  customMem.customAlloc = (ZSTD_allocFunction)samples;
  customMem.opaque = unaff_RBX;
  cctx = ZSTD_createCCtx_advanced(customMem);
  cdict = ZSTD_createCDict(dict,dictBufferCapacity,parameters.zParams.compressionLevel);
  sVar5 = 0xffffffffffffffff;
  if ((cdict != (ZSTD_CDict *)0x0 && (cctx != (ZSTD_CCtx *)0x0 && dst != (void *)0x0)) &&
     (sVar5 = dictBufferCapacity, nbTrainSamples < nbSamples)) {
    do {
      sVar2 = ZSTD_compress_usingCDict_internal
                        (cctx,dst,__size,samples + offsets[nbTrainSamples],
                         samplesSizes[nbTrainSamples],cdict,(ZSTD_frameParameters)ZEXT812(1));
      if (0xffffffffffffff88 < sVar2) {
        sVar5 = 0;
      }
      sVar5 = sVar5 + sVar2;
    } while ((sVar2 < 0xffffffffffffff89) &&
            (bVar6 = nbSamples - 1 != nbTrainSamples, nbTrainSamples = nbTrainSamples + 1, bVar6));
  }
  ZSTD_freeCCtx(cctx);
  ZSTD_freeCDict(cdict);
  if (dst != (void *)0x0) {
    free(dst);
  }
  return sVar5;
}

Assistant:

size_t COVER_checkTotalCompressedSize(const ZDICT_cover_params_t parameters,
                                    const size_t *samplesSizes, const BYTE *samples,
                                    size_t *offsets,
                                    size_t nbTrainSamples, size_t nbSamples,
                                    BYTE *const dict, size_t dictBufferCapacity) {
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Pointers */
  ZSTD_CCtx *cctx;
  ZSTD_CDict *cdict;
  void *dst;
  /* Local variables */
  size_t dstCapacity;
  size_t i;
  /* Allocate dst with enough space to compress the maximum sized sample */
  {
    size_t maxSampleSize = 0;
    i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
    for (; i < nbSamples; ++i) {
      maxSampleSize = MAX(samplesSizes[i], maxSampleSize);
    }
    dstCapacity = ZSTD_compressBound(maxSampleSize);
    dst = malloc(dstCapacity);
  }
  /* Create the cctx and cdict */
  cctx = ZSTD_createCCtx();
  cdict = ZSTD_createCDict(dict, dictBufferCapacity,
                           parameters.zParams.compressionLevel);
  if (!dst || !cctx || !cdict) {
    goto _compressCleanup;
  }
  /* Compress each sample and sum their sizes (or error) */
  totalCompressedSize = dictBufferCapacity;
  i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
  for (; i < nbSamples; ++i) {
    const size_t size = ZSTD_compress_usingCDict(
        cctx, dst, dstCapacity, samples + offsets[i],
        samplesSizes[i], cdict);
    if (ZSTD_isError(size)) {
      totalCompressedSize = size;
      goto _compressCleanup;
    }
    totalCompressedSize += size;
  }
_compressCleanup:
  ZSTD_freeCCtx(cctx);
  ZSTD_freeCDict(cdict);
  if (dst) {
    free(dst);
  }
  return totalCompressedSize;
}